

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O2

bool __thiscall SimpleVendor::ProcessUserInput(SimpleVendor *this)

{
  int *piVar1;
  uint uVar2;
  
  uVar2 = (*this->vio->_vptr_VendorIo[8])();
  if ((char)uVar2 == 'D') {
LAB_00144cbe:
    piVar1 = &(this->super_Vendor).balance_;
    *piVar1 = *piVar1 + 10;
    return true;
  }
  uVar2 = uVar2 & 0xff;
  if (uVar2 == 0x45) {
LAB_00144c98:
    DispenseChange(this);
    (*this->vio->_vptr_VendorIo[7])();
    return false;
  }
  if (uVar2 == 0x4e) {
LAB_00144c92:
    piVar1 = &(this->super_Vendor).balance_;
    *piVar1 = *piVar1 + 5;
    return true;
  }
  if (uVar2 == 0x51) {
LAB_00144cae:
    piVar1 = &(this->super_Vendor).balance_;
    *piVar1 = *piVar1 + 0x19;
  }
  else {
    if (uVar2 != 0x52) {
      if (uVar2 == 100) goto LAB_00144cbe;
      if (uVar2 == 0x65) goto LAB_00144c98;
      if (uVar2 != 0x72) {
        if (uVar2 != 0x71) {
          if (uVar2 != 0x6e) {
            (**this->vio->_vptr_VendorIo)(this->vio,"Unknown coin - rejected");
            return true;
          }
          goto LAB_00144c92;
        }
        goto LAB_00144cae;
      }
    }
    DispenseChange(this);
  }
  return true;
}

Assistant:

bool SimpleVendor::ProcessUserInput() {
    switch (vio->GetUserInput()) {
        case 'n':
        case 'N':
            SetBalance(GetBalance() + VALUE_NICKLE);
            break;
        case 'd':
        case 'D':
            SetBalance(GetBalance() + VALUE_DIME);
            break;
        case 'q':
        case 'Q':
            SetBalance(GetBalance() + VALUE_QUARTER);
            break;
        case 'e':
        case 'E':
            DispenseChange();
            vio->PrintExitMessage();
            return false;
        case 'r':
        case 'R':
            DispenseChange();
            break;
        default:
            vio->PrintErrorMessage("Unknown coin - rejected");
    }
    return true;
}